

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

void __thiscall wasm::PassRunner::PassRunner(PassRunner *this,PassRunner *runner)

{
  PassRunner *runner_local;
  PassRunner *this_local;
  
  this->_vptr_PassRunner = (_func_int **)&PTR__PassRunner_03099c60;
  this->wasm = runner->wasm;
  this->allocator = runner->allocator;
  std::
  vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ::vector(&this->passes);
  PassOptions::PassOptions(&this->options,&runner->options);
  this->isNested = true;
  this->addedPassesRemovedDWARF = false;
  return;
}

Assistant:

explicit PassRunner(const PassRunner* runner)
    : wasm(runner->wasm), allocator(runner->allocator),
      options(runner->options), isNested(true) {}